

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

DirHandle * openDirectory(PHYSFS_Io *io,char *d,int forWriting)

{
  int iVar1;
  bool bVar2;
  PHYSFS_ErrorCode local_54;
  int local_48;
  PHYSFS_ErrorCode errcode;
  int claimed;
  int created_io;
  char *ext;
  PHYSFS_Archiver **i;
  DirHandle *retval;
  char *pcStack_20;
  int forWriting_local;
  char *d_local;
  PHYSFS_Io *io_local;
  
  i = (PHYSFS_Archiver **)0x0;
  errcode = PHYSFS_ERR_OK;
  local_48 = 0;
  retval._4_4_ = forWriting;
  pcStack_20 = d;
  d_local = (char *)io;
  if ((io == (PHYSFS_Io *)0x0) && (d == (char *)0x0)) {
    __assert_fail("(io != NULL) || (d != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs.c"
                  ,0x36e,"DirHandle *openDirectory(PHYSFS_Io *, const char *, int)");
  }
  if (io == (PHYSFS_Io *)0x0) {
    i = (PHYSFS_Archiver **)
        tryOpenDir((PHYSFS_Io *)0x0,&__PHYSFS_Archiver_DIR,d,forWriting,&local_48);
    if ((DirHandle *)i != (DirHandle *)0x0) {
      return (DirHandle *)i;
    }
    if (local_48 != 0) {
      return (DirHandle *)0x0;
    }
    iVar1 = 0x72;
    if (retval._4_4_ != 0) {
      iVar1 = 0x77;
    }
    d_local = (char *)__PHYSFS_createNativeIo(pcStack_20,iVar1);
    if ((PHYSFS_Io *)d_local == (PHYSFS_Io *)0x0) {
      return (DirHandle *)0x0;
    }
    errcode = PHYSFS_ERR_OTHER_ERROR;
  }
  _claimed = find_filename_extension(pcStack_20);
  if (_claimed == (char *)0x0) {
    ext = (char *)archivers;
    while( true ) {
      bVar2 = false;
      if ((*(long *)ext != 0) && (bVar2 = false, i == (PHYSFS_Archiver **)0x0)) {
        bVar2 = local_48 == 0;
      }
      if (!bVar2) break;
      i = (PHYSFS_Archiver **)
          tryOpenDir((PHYSFS_Io *)d_local,*(PHYSFS_Archiver **)ext,pcStack_20,retval._4_4_,&local_48
                    );
      ext = ext + 8;
    }
  }
  else {
    ext = (char *)archivers;
    while( true ) {
      bVar2 = false;
      if ((*(long *)ext != 0) && (bVar2 = false, i == (PHYSFS_Archiver **)0x0)) {
        bVar2 = local_48 == 0;
      }
      if (!bVar2) break;
      iVar1 = PHYSFS_utf8stricmp(_claimed,*(char **)(*(long *)ext + 8));
      if (iVar1 == 0) {
        i = (PHYSFS_Archiver **)
            tryOpenDir((PHYSFS_Io *)d_local,*(PHYSFS_Archiver **)ext,pcStack_20,retval._4_4_,
                       &local_48);
      }
      ext = ext + 8;
    }
    ext = (char *)archivers;
    while( true ) {
      bVar2 = false;
      if ((*(long *)ext != 0) && (bVar2 = false, i == (PHYSFS_Archiver **)0x0)) {
        bVar2 = local_48 == 0;
      }
      if (!bVar2) break;
      iVar1 = PHYSFS_utf8stricmp(_claimed,*(char **)(*(long *)ext + 8));
      if (iVar1 != 0) {
        i = (PHYSFS_Archiver **)
            tryOpenDir((PHYSFS_Io *)d_local,*(PHYSFS_Archiver **)ext,pcStack_20,retval._4_4_,
                       &local_48);
      }
      ext = ext + 8;
    }
  }
  local_54 = currentErrorCode();
  if ((i == (PHYSFS_Archiver **)0x0) && (errcode != PHYSFS_ERR_OK)) {
    (**(code **)(d_local + 0x48))(d_local);
  }
  if (i == (PHYSFS_Archiver **)0x0) {
    if ((local_48 == 0) || (local_54 != PHYSFS_ERR_OK)) {
      if (local_48 == 0) {
        local_54 = PHYSFS_ERR_UNSUPPORTED;
      }
      PHYSFS_setErrorCode(local_54);
    }
    io_local = (PHYSFS_Io *)0x0;
  }
  else {
    io_local = (PHYSFS_Io *)i;
  }
  return (DirHandle *)io_local;
}

Assistant:

static DirHandle *openDirectory(PHYSFS_Io *io, const char *d, int forWriting)
{
    DirHandle *retval = NULL;
    PHYSFS_Archiver **i;
    const char *ext;
    int created_io = 0;
    int claimed = 0;
    PHYSFS_ErrorCode errcode;

    assert((io != NULL) || (d != NULL));

    if (io == NULL)
    {
        /* DIR gets first shot (unlike the rest, it doesn't deal with files). */
        retval = tryOpenDir(io, &__PHYSFS_Archiver_DIR, d, forWriting, &claimed);
        if (retval || claimed)
            return retval;

        io = __PHYSFS_createNativeIo(d, forWriting ? 'w' : 'r');
        BAIL_IF_ERRPASS(!io, 0);
        created_io = 1;
    } /* if */

    ext = find_filename_extension(d);
    if (ext != NULL)
    {
        /* Look for archivers with matching file extensions first... */
        for (i = archivers; (*i != NULL) && (retval == NULL) && !claimed; i++)
        {
            if (PHYSFS_utf8stricmp(ext, (*i)->info.extension) == 0)
                retval = tryOpenDir(io, *i, d, forWriting, &claimed);
        } /* for */

        /* failing an exact file extension match, try all the others... */
        for (i = archivers; (*i != NULL) && (retval == NULL) && !claimed; i++)
        {
            if (PHYSFS_utf8stricmp(ext, (*i)->info.extension) != 0)
                retval = tryOpenDir(io, *i, d, forWriting, &claimed);
        } /* for */
    } /* if */

    else  /* no extension? Try them all. */
    {
        for (i = archivers; (*i != NULL) && (retval == NULL) && !claimed; i++)
            retval = tryOpenDir(io, *i, d, forWriting, &claimed);
    } /* else */

    errcode = currentErrorCode();

    if ((!retval) && (created_io))
        io->destroy(io);

    BAIL_IF(!retval, claimed ? errcode : PHYSFS_ERR_UNSUPPORTED, NULL);
    return retval;
}